

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O0

void __thiscall
WAsmJs::TypedRegisterAllocator::CommitToFunctionInfo
          (TypedRegisterAllocator *this,AsmJsFunctionInfo *funcInfo,FunctionBody *body)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  code *pcVar5;
  bool bVar6;
  uint uVar7;
  LocalFunctionId LVar8;
  int iVar9;
  RegSlot RVar10;
  uint32 uVar11;
  uint32 uVar12;
  uint32 uVar13;
  undefined4 extraout_var;
  TypedSlotInfo *pTVar14;
  RegisterSpace *this_00;
  undefined4 *puVar15;
  uint local_9c;
  uint32 jsVarNeededForVars;
  uint32 totalVarsNeeded;
  uint32 jsVarUsedForConstsTable;
  uint32 bytesUsedForConst;
  uint32 stackByteSize;
  char16 buf [16];
  uint32 totalTypeCount;
  RegisterSpace *registerSpace;
  TypedSlotInfo *slotInfo;
  Types local_40;
  Types type;
  int i;
  TypedConstSourcesInfo constSourcesInfo;
  uint32 offset;
  FunctionBody *body_local;
  AsmJsFunctionInfo *funcInfo_local;
  TypedRegisterAllocator *this_local;
  
  constSourcesInfo.srcByteOffsets[4] = 0x28;
  unique0x10000443 = body;
  GetConstSourceInfos((TypedConstSourcesInfo *)&type,this);
  uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)stack0xffffffffffffffe0);
  LVar8 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)stack0xffffffffffffffe0);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,AsmjsInterpreterStackPhase,uVar7,LVar8);
  if (bVar6) {
    iVar9 = (*(stack0xffffffffffffffe0->super_ParseableFunctionInfo).super_FunctionProxy.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                      ();
    Output::Print(L"ASMFunctionInfo Stack Data for %s\n",CONCAT44(extraout_var,iVar9));
    Output::Print(L"==========================\n");
    Output::Print(L"RequiredVarConstants:%d\n",5);
  }
  for (local_40 = INT32; (int)local_40 < 5; local_40 = local_40 + INT64) {
    pTVar14 = Js::AsmJsFunctionInfo::GetTypedSlotInfo(funcInfo,local_40);
    bVar6 = IsTypeExcluded(this,local_40);
    if (!bVar6) {
      this_00 = GetRegisterSpace(this,local_40);
      RVar10 = RegisterSpace::GetConstCount(this_00);
      pTVar14->constCount = RVar10;
      RVar10 = RegisterSpace::GetVarCount(this_00);
      pTVar14->varCount = RVar10;
      RVar10 = RegisterSpace::GetTmpCount(this_00);
      uVar12 = constSourcesInfo.srcByteOffsets[4];
      pTVar14->tmpCount = RVar10;
      pTVar14->constSrcByteOffset = (&type)[(int)local_40];
      uVar11 = GetTypeByteSize(local_40);
      constSourcesInfo.srcByteOffsets[4] = Math::AlignOverflowCheck<unsigned_int>(uVar12,uVar11);
      pTVar14->byteOffset = constSourcesInfo.srcByteOffsets[4];
      uVar12 = UInt32Math::Add(0,pTVar14->constCount);
      uVar12 = UInt32Math::Add(uVar12,pTVar14->varCount);
      uVar11 = UInt32Math::Add(uVar12,pTVar14->tmpCount);
      uVar12 = constSourcesInfo.srcByteOffsets[4];
      uVar13 = GetTypeByteSize(local_40);
      uVar13 = UInt32Math::Mul(uVar11,uVar13);
      constSourcesInfo.srcByteOffsets[4] = UInt32Math::Add(uVar12,uVar13);
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)stack0xffffffffffffffe0);
      LVar8 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)stack0xffffffffffffffe0);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,AsmjsInterpreterStackPhase,uVar7,LVar8);
      if (bVar6) {
        RegisterSpace::GetTypeDebugName(local_40,(char16 *)&bytesUsedForConst,0x10,false);
        uVar1 = pTVar14->byteOffset;
        uVar2 = pTVar14->constCount;
        uVar3 = pTVar14->varCount;
        uVar4 = pTVar14->tmpCount;
        uVar12 = GetTypeByteSize(local_40);
        uVar13 = GetTypeByteSize(local_40);
        Output::Print(L"%s Offset:%d  ConstCount:%d  VarCount:%d  TmpCount:%d = %d * %d = 0x%x bytes\n"
                      ,&bytesUsedForConst,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,uVar11
                      ,uVar12,uVar11 * uVar13);
      }
    }
  }
  Js::AsmJsFunctionInfo::SetTotalSizeinBytes(funcInfo,constSourcesInfo.srcByteOffsets[4]);
  uVar12 = constSourcesInfo.srcByteOffsets[4];
  uVar11 = ConvertOffset<unsigned_char,void*>(constSourcesInfo.srcByteOffsets[3]);
  uVar13 = ConvertOffset<unsigned_char,void*>(uVar12);
  local_9c = uVar13 - uVar11;
  if (uVar13 < uVar11) {
    local_9c = 0;
  }
  if (uVar11 + local_9c < uVar13) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar15 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/WAsmjsUtils.cpp"
                       ,0x135,"((jsVarUsedForConstsTable + jsVarNeededForVars) >= totalVarsNeeded)",
                       "(jsVarUsedForConstsTable + jsVarNeededForVars) >= totalVarsNeeded");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar15 = 0;
  }
  Js::FunctionBody::CheckAndSetVarCount(stack0xffffffffffffffe0,local_9c);
  uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)stack0xffffffffffffffe0);
  LVar8 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)stack0xffffffffffffffe0);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,AsmjsInterpreterStackPhase,uVar7,LVar8);
  if (bVar6) {
    Output::Print(L"Total memory required: (%u consts + %u vars) * sizeof(Js::Var) >= %u * sizeof(Js::Var) = 0x%x bytes\n"
                  ,(ulong)uVar11,(ulong)local_9c,(ulong)uVar13,(ulong)uVar12);
  }
  return;
}

Assistant:

void TypedRegisterAllocator::CommitToFunctionInfo(Js::AsmJsFunctionInfo* funcInfo, Js::FunctionBody* body) const
    {
        uint32 offset = Js::AsmJsFunctionMemory::RequiredVarConstants * sizeof(Js::Var);
        WAsmJs::TypedConstSourcesInfo constSourcesInfo = GetConstSourceInfos();

#if DBG_DUMP
        if (PHASE_TRACE(Js::AsmjsInterpreterStackPhase, body))
        {
            Output::Print(_u("ASMFunctionInfo Stack Data for %s\n"), body->GetDisplayName());
            Output::Print(_u("==========================\n"));
            Output::Print(_u("RequiredVarConstants:%d\n"), Js::AsmJsFunctionMemory::RequiredVarConstants);
        }
#endif

        for (int i = 0; i < WAsmJs::LIMIT; ++i)
        {
            Types type = (Types)i;

            TypedSlotInfo& slotInfo = *funcInfo->GetTypedSlotInfo(type);
            // Check if we don't want to commit this type
            if (!IsTypeExcluded(type))
            {
                RegisterSpace* registerSpace = GetRegisterSpace(type);
                slotInfo.constCount = registerSpace->GetConstCount();
                slotInfo.varCount = registerSpace->GetVarCount();
                slotInfo.tmpCount = registerSpace->GetTmpCount();
                slotInfo.constSrcByteOffset = constSourcesInfo.srcByteOffsets[i];

                offset = Math::AlignOverflowCheck(offset, GetTypeByteSize(type));
                slotInfo.byteOffset = offset;

                // Update offset for next type
                uint32 totalTypeCount = 0;
                totalTypeCount = UInt32Math::Add(totalTypeCount, slotInfo.constCount);
                totalTypeCount = UInt32Math::Add(totalTypeCount, slotInfo.varCount);
                totalTypeCount = UInt32Math::Add(totalTypeCount, slotInfo.tmpCount);

                offset = UInt32Math::Add(offset, UInt32Math::Mul(totalTypeCount, GetTypeByteSize(type)));
#if DBG_DUMP
                if (PHASE_TRACE(Js::AsmjsInterpreterStackPhase, body))
                {
                    char16 buf[16];
                    RegisterSpace::GetTypeDebugName(type, buf, 16);
                    Output::Print(_u("%s Offset:%d  ConstCount:%d  VarCount:%d  TmpCount:%d = %d * %d = 0x%x bytes\n"),
                                  buf,
                                  slotInfo.byteOffset,
                                  slotInfo.constCount,
                                  slotInfo.varCount,
                                  slotInfo.tmpCount,
                                  totalTypeCount,
                                  GetTypeByteSize(type),
                                  totalTypeCount * GetTypeByteSize(type));
                }
#endif
            }
        }

        // The offset currently carries the total size of the funcInfo after handling the last type
        funcInfo->SetTotalSizeinBytes(offset);

        // These bytes offset already calculated the alignment, used them to determine how many Js::Var we need to do the allocation
        uint32 stackByteSize = offset;
        uint32 bytesUsedForConst = constSourcesInfo.bytesUsed;
        uint32 jsVarUsedForConstsTable = ConvertOffset<byte, Js::Var>(bytesUsedForConst);
        uint32 totalVarsNeeded = ConvertOffset<byte, Js::Var>(stackByteSize);

        uint32 jsVarNeededForVars = totalVarsNeeded - jsVarUsedForConstsTable;
        if (totalVarsNeeded < jsVarUsedForConstsTable)
        {
            // If for some reason we allocated more space in the const table than what we need, just don't allocate anymore vars
            jsVarNeededForVars = 0;
        }

        Assert((jsVarUsedForConstsTable + jsVarNeededForVars) >= totalVarsNeeded);
        body->CheckAndSetVarCount(jsVarNeededForVars);

#if DBG_DUMP
        if (PHASE_TRACE(Js::AsmjsInterpreterStackPhase, body))
        {
            Output::Print(_u("Total memory required: (%u consts + %u vars) * sizeof(Js::Var) >= %u * sizeof(Js::Var) = 0x%x bytes\n"),
                          jsVarUsedForConstsTable,
                          jsVarNeededForVars,
                          totalVarsNeeded,
                          stackByteSize);
        }
#endif
    }